

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O2

void duckdb::FiltersNullValues
               (LogicalType *type,TableFilter *filter,bool *filters_nulls,bool *filters_valid_values
               ,TableFilterState *filter_state)

{
  bool bVar1;
  ConjunctionOrFilter *pCVar2;
  ConjunctionAndFilter *pCVar3;
  const_reference pvVar4;
  type pTVar5;
  reference pvVar6;
  type pTVar7;
  ExpressionFilter *this;
  InternalException *this_00;
  idx_t child_idx_1;
  ulong uVar8;
  idx_t child_idx;
  bool child_filters_valid_values;
  vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
  *local_98;
  LogicalType *local_90;
  bool child_filters_nulls;
  LogicalType local_48;
  
  *filters_nulls = false;
  *filters_valid_values = false;
  local_98 = (vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
              *)filter_state;
  local_90 = type;
  switch(filter->filter_type) {
  case CONSTANT_COMPARISON:
  case IS_NOT_NULL:
    *filters_nulls = true;
    break;
  case IS_NULL:
    *filters_valid_values = true;
    break;
  case CONJUNCTION_OR:
    pCVar2 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(filter);
    *filters_nulls = true;
    *filters_valid_values = true;
    local_98 = (vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                *)((long)local_98 + 8);
    for (uVar8 = 0;
        uVar8 < (ulong)((long)(pCVar2->super_ConjunctionFilter).child_filters.
                              super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pCVar2->super_ConjunctionFilter).child_filters.
                              super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
               ::get<true>(&(pCVar2->super_ConjunctionFilter).child_filters,uVar8);
      pTVar5 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator*(pvVar4);
      pvVar6 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
               ::get<true>(local_98,uVar8);
      pTVar7 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
               ::operator*(pvVar6);
      FiltersNullValues(local_90,pTVar5,&child_filters_nulls,&child_filters_valid_values,pTVar7);
      bVar1 = child_filters_nulls;
      if (*filters_nulls == false) {
        bVar1 = false;
      }
      *filters_nulls = bVar1;
      bVar1 = child_filters_valid_values;
      if (*filters_valid_values == false) {
        bVar1 = false;
      }
      *filters_valid_values = bVar1;
    }
    break;
  case CONJUNCTION_AND:
    pCVar3 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
    *filters_nulls = false;
    *filters_valid_values = false;
    local_98 = (vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                *)((long)local_98 + 8);
    for (uVar8 = 0;
        uVar8 < (ulong)((long)(pCVar3->super_ConjunctionFilter).child_filters.
                              super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pCVar3->super_ConjunctionFilter).child_filters.
                              super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
               ::get<true>(&(pCVar3->super_ConjunctionFilter).child_filters,uVar8);
      pTVar5 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator*(pvVar4);
      pvVar6 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
               ::get<true>(local_98,uVar8);
      pTVar7 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
               ::operator*(pvVar6);
      FiltersNullValues(local_90,pTVar5,&child_filters_nulls,&child_filters_valid_values,pTVar7);
      bVar1 = child_filters_nulls;
      if (*filters_nulls != false) {
        bVar1 = true;
      }
      *filters_nulls = bVar1;
      bVar1 = child_filters_valid_values;
      if (*filters_valid_values != false) {
        bVar1 = true;
      }
      *filters_valid_values = bVar1;
    }
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&child_filters_nulls,
               "FIXME: unsupported type for filter selection in validity select",
               (allocator *)&child_filters_valid_values);
    InternalException::InternalException(this_00,(string *)&child_filters_nulls);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case OPTIONAL_FILTER:
    break;
  case EXPRESSION_FILTER:
    this = TableFilter::Cast<duckdb::ExpressionFilter>(filter);
    LogicalType::LogicalType(&local_48,local_90);
    Value::Value((Value *)&child_filters_nulls,&local_48);
    LogicalType::~LogicalType(&local_48);
    bVar1 = ExpressionFilter::EvaluateWithConstant
                      (this,(ExpressionExecutor *)((long)local_98 + 8),(Value *)&child_filters_nulls
                      );
    *filters_nulls = bVar1;
    *filters_valid_values = false;
    Value::~Value((Value *)&child_filters_nulls);
  }
  return;
}

Assistant:

void FiltersNullValues(const LogicalType &type, const TableFilter &filter, bool &filters_nulls,
                       bool &filters_valid_values, TableFilterState &filter_state) {
	filters_nulls = false;
	filters_valid_values = false;

	switch (filter.filter_type) {
	case TableFilterType::OPTIONAL_FILTER:
		break;
	case TableFilterType::CONJUNCTION_OR: {
		auto &conjunction_or = filter.Cast<ConjunctionOrFilter>();
		auto &state = filter_state.Cast<ConjunctionOrFilterState>();
		filters_nulls = true;
		filters_valid_values = true;
		for (idx_t child_idx = 0; child_idx < conjunction_or.child_filters.size(); child_idx++) {
			auto &child_filter = *conjunction_or.child_filters[child_idx];
			auto &child_state = *state.child_states[child_idx];
			bool child_filters_nulls, child_filters_valid_values;
			FiltersNullValues(type, child_filter, child_filters_nulls, child_filters_valid_values, child_state);
			filters_nulls = filters_nulls && child_filters_nulls;
			filters_valid_values = filters_valid_values && child_filters_valid_values;
		}
		break;
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction_and = filter.Cast<ConjunctionAndFilter>();
		auto &state = filter_state.Cast<ConjunctionAndFilterState>();
		filters_nulls = false;
		filters_valid_values = false;
		for (idx_t child_idx = 0; child_idx < conjunction_and.child_filters.size(); child_idx++) {
			auto &child_filter = *conjunction_and.child_filters[child_idx];
			auto &child_state = *state.child_states[child_idx];
			bool child_filters_nulls, child_filters_valid_values;
			FiltersNullValues(type, child_filter, child_filters_nulls, child_filters_valid_values, child_state);
			filters_nulls = filters_nulls || child_filters_nulls;
			filters_valid_values = filters_valid_values || child_filters_valid_values;
		}
		break;
	}
	case TableFilterType::CONSTANT_COMPARISON:
		filters_nulls = true;
		break;
	case TableFilterType::IS_NULL:
		filters_valid_values = true;
		break;
	case TableFilterType::IS_NOT_NULL:
		filters_nulls = true;
		break;
	case TableFilterType::EXPRESSION_FILTER: {
		auto &expr_filter = filter.Cast<ExpressionFilter>();
		auto &state = filter_state.Cast<ExpressionFilterState>();
		Value val(type);
		filters_nulls = expr_filter.EvaluateWithConstant(state.executor, val);
		filters_valid_values = false;
		break;
	}
	default:
		throw InternalException("FIXME: unsupported type for filter selection in validity select");
	}
}